

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fiosav(voccxdef *vctx,char *fname,char *game_fname)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FILE *__s;
  size_t sVar4;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t len;
  fiosav_cb_ctx fnctx;
  int err;
  uchar buf [8];
  mcmcxdef *mctx;
  int propcnt;
  uint mutsiz;
  uchar *mut;
  uchar *p;
  objnum obj;
  int j;
  int i;
  vocidef **v;
  vocidef ***vpg;
  osfildef *fp;
  mcmon in_stack_ffffffffffffff5e;
  mcmcxdef *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  vocddef *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 local_70;
  undefined1 auStack_6f [2];
  undefined1 auStack_6d [2];
  undefined1 uStack_6b;
  undefined1 auStack_6a [2];
  undefined8 *local_68;
  uint local_60;
  uint local_5c;
  void *in_stack_ffffffffffffffa8;
  mcmcxdef *in_stack_ffffffffffffffb0;
  ushort in_stack_ffffffffffffffbe;
  int in_stack_ffffffffffffffc0;
  int iVar5;
  long *local_38;
  long *local_30;
  
  local_68 = *(undefined8 **)(in_RDI + 0x18);
  bVar1 = false;
  __s = fopen(in_RSI,"wb");
  if (__s == (FILE *)0x0) {
    return 1;
  }
  if (in_RDX != (char *)0x0) {
    in_stack_ffffffffffffff70 = (vocddef *)strlen(in_RDX);
    oswp2(&local_70,(uint)in_stack_ffffffffffffff70);
    sVar4 = fwrite("TADS2 save/g\n\r\x1a",0x10,1,__s);
    if (((sVar4 != 1) || (sVar4 = fwrite(&local_70,2,1,__s), sVar4 != 1)) ||
       (sVar4 = fwrite(in_RDX,(long)(int)in_stack_ffffffffffffff70,1,__s), sVar4 != 1))
    goto LAB_001456a2;
  }
  sVar4 = fwrite("TADS2 save\n\r\x1a",0xe,1,__s);
  if (((sVar4 == 1) && (sVar4 = fwrite("v2.2.1",7,1,__s), sVar4 == 1)) &&
     (sVar4 = fwrite((void *)(in_RDI + 0xf24),0x1a,1,__s), sVar4 == 1)) {
    local_30 = (long *)(in_RDI + 0x58);
    for (iVar5 = 0; iVar5 < 0x80; iVar5 = iVar5 + 1) {
      if (*local_30 != 0) {
        local_38 = (long *)*local_30;
        in_stack_ffffffffffffffbe = (ushort)(iVar5 << 8);
        for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < 0x100;
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
          if ((*local_38 != 0) &&
             ((*(ushort *)
                (*(long *)(*(long *)*local_68 +
                          (long)((int)(uint)*(ushort *)
                                             (local_68[(long)((int)(uint)in_stack_ffffffffffffffbe
                                                             >> 8) + 6] +
                                             (long)(int)(in_stack_ffffffffffffffbe & 0xff) * 2) >> 8
                                ) * 8) +
                 (long)(int)(*(ushort *)
                              (local_68[(long)((int)(uint)in_stack_ffffffffffffffbe >> 8) + 6] +
                              (long)(int)(in_stack_ffffffffffffffbe & 0xff) * 2) & 0xff) * 0x20 +
                0x14) & 3) != 0)) {
            in_stack_ffffffffffffff60 =
                 (mcmcxdef *)
                 mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (mcmon)((ulong)in_stack_ffffffffffffff60 >> 0x30));
            in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff60;
            uVar2 = osrp2(&in_stack_ffffffffffffff60->mcmcxmsz);
            in_stack_ffffffffffffffa8 =
                 (void *)((long)in_stack_ffffffffffffff60->mcmcxmtb +
                         (long)(int)(uVar2 & 0xffff) + -0x30);
            local_60 = osrp2((uchar *)((long)&in_stack_ffffffffffffffb0->mcmcxgl + 6));
            local_60 = local_60 & 0xffff;
            in_stack_ffffffffffffff6c = osrp2(&in_stack_ffffffffffffffb0->mcmcxflg);
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c & 0xffff;
            uVar2 = osrp2(&in_stack_ffffffffffffffb0->mcmcxmsz);
            local_5c = in_stack_ffffffffffffff6c - (uVar2 & 0xffff);
            uVar2 = osrp2((uchar *)((long)&in_stack_ffffffffffffffb0->mcmcxgl + 2));
            if ((uVar2 & 2) != 0) {
              local_5c = local_60 * 4 + local_5c;
            }
            if ((*(byte *)(*local_38 + 8) & 0x10) == 0) {
              if (local_5c != 0) {
                local_70 = 0;
                oswp2(auStack_6f,(uint)in_stack_ffffffffffffffbe);
                oswp2(auStack_6d,local_60);
                oswp2(&uStack_6b,local_5c);
                sVar4 = fwrite(&local_70,7,1,__s);
                if ((sVar4 != 1) ||
                   (sVar4 = fwrite(in_stack_ffffffffffffffa8,(ulong)local_5c,1,__s), sVar4 != 1)) {
                  bVar1 = true;
                }
              }
            }
            else {
              local_70 = 1;
              oswp2(auStack_6f,(uint)in_stack_ffffffffffffffbe);
              local_5c = osrp2(&in_stack_ffffffffffffffb0->mcmcxflg);
              local_5c = local_5c & 0xffff;
              oswp2(auStack_6d,local_5c);
              sVar4 = fwrite(&local_70,7,1,__s);
              if ((sVar4 != 1) ||
                 (sVar4 = fwrite(in_stack_ffffffffffffffb0,(ulong)local_5c,1,__s), sVar4 != 1)) {
                bVar1 = true;
              }
            }
            mcmunlck(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e);
            if (bVar1) goto LAB_001456a2;
          }
          local_38 = local_38 + 1;
          in_stack_ffffffffffffffbe = in_stack_ffffffffffffffbe + 1;
        }
      }
      local_30 = local_30 + 1;
    }
    local_70 = 0;
    oswp2(auStack_6f,0xffff);
    oswp4(auStack_6d,0);
    sVar4 = fwrite(&local_70,7,1,__s);
    if ((((sVar4 == 1) &&
         (iVar3 = fiowfda((osfildef *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c), iVar3 == 0)) &&
        (iVar3 = fiowfda((osfildef *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c), iVar3 == 0)) &&
       (iVar3 = fiowfda((osfildef *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c), iVar3 == 0)) {
      iVar3 = 0;
      voc_iterate((voccxdef *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbe,
                  (_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *)in_stack_ffffffffffffffb0,
                  in_stack_ffffffffffffffa8);
      if (iVar3 == 0) {
        oswp2(auStack_6a,0xffff);
        sVar4 = fwrite(&local_70,8,1,__s);
        if (sVar4 == 1) {
          oswp2(&local_70,(uint)*(ushort *)(in_RDI + 0xf40));
          sVar4 = fwrite(&local_70,2,1,__s);
          if (sVar4 == 1) {
            fclose(__s);
            os_settype(in_RSI,1);
            return 0;
          }
        }
      }
    }
  }
LAB_001456a2:
  fclose(__s);
  return 1;
}

Assistant:

int fiosav(voccxdef *vctx, char *fname, char *game_fname)
{
    osfildef   *fp;
    vocidef  ***vpg;
    vocidef   **v;
    int         i;
    int         j;
    objnum      obj;
    uchar      *p;
    uchar      *mut;
    uint        mutsiz;
    int         propcnt;
    mcmcxdef   *mctx = vctx->voccxmem;
    uchar       buf[8];
    int         err = FALSE;
    struct fiosav_cb_ctx  fnctx;

    /* open the output file */
    if ((fp = osfopwb(fname, OSFTSAVE)) == 0)
        return TRUE;

    /*
     *   If we have game file information, save the game file information
     *   with the saved game file.  This lets the player start the
     *   run-time and restore the game by specifying only the saved game
     *   file.  
     */
    if (game_fname != 0)
    {
        size_t len;
        
        /* write the prefix header */
        len = strlen(game_fname);
        oswp2(buf, len);
        if (osfwb(fp, FIOSAVHDR_PREFIX, (int)sizeof(FIOSAVHDR_PREFIX))
            || osfwb(fp, buf, 2)
            || osfwb(fp, game_fname, (int)len))
            goto ret_error;
    }
    
    /* write save game header and timestamp */
    if (osfwb(fp, FIOSAVHDR, (int)sizeof(FIOSAVHDR))
        || osfwb(fp, FIOSAVVSN, (int)sizeof(FIOSAVVSN))
        || osfwb(fp, vctx->voccxtim, 26))
        goto ret_error;

    /* go through each object, and write if it's been changed */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v != 0)
            {
                /* write object if it's dirty */
                if (mcmobjdirty(mctx, (mcmon)obj))
                {
                    p = mcmlck(mctx, (mcmon)obj);
                    mut = p + objrst(p);
                    propcnt = objnprop(p);
                    mutsiz = objfree(p) - objrst(p);
                    if ((objflg(p) & OBJFINDEX) != 0)
                        mutsiz += propcnt * 4;

                    /*
                     *   If the object was dynamically allocated, write
                     *   the whole object.  Otherwise, write just the
                     *   mutable part. 
                     */
                    if ((*v)->vociflg & VOCIFNEW)
                    {
                        /* indicate that the object is dynamic */
                        buf[0] = 1;
                        oswp2(buf + 1, obj);

                        /* write the entire object */
                        mutsiz = objfree(p);
                        oswp2(buf + 3, mutsiz);
                        if (osfwb(fp, buf, 7)
                            || osfwb(fp, p, mutsiz))
                            err = TRUE;

#ifdef NEVER
                        {
                            int         wrdcnt;
                            
                            /* count the words, and write the count */
                            voc_count(vctx, obj, 0, &wrdcnt, (int *)0);
                            oswp2(buf, wrdcnt);
                            if (osfwb(fp, buf, 2))
                                err = TRUE;
                            
                            /* write the words */
                            fnctx.err = 0;
                            fnctx.fp = fp;
                            voc_iterate(vctx, obj, fiosav_cb, &fnctx);
                            if (fnctx.err != 0)
                                err = TRUE;
                        }
#endif
                    }
                    else if (mutsiz)
                    {
                        /* write number of properties, size of mut, and mut */
                        buf[0] = 0;   /* indicate that the object is static */
                        oswp2(buf + 1, obj);
                        oswp2(buf + 3, propcnt);
                        oswp2(buf + 5, mutsiz);
                        if (osfwb(fp, buf, 7)
                            || osfwb(fp, mut, mutsiz))
                            err = TRUE;
                    }
                    
                    mcmunlck(mctx, (mcmon)obj);
                    if (err != 0)
                        goto ret_error;
                }
            }
        }
    }

    /* write end-of-objects indication */
    buf[0] = 0;
    oswp2(buf + 1, MCMONINV);
    oswp4(buf + 3, 0);
    if (osfwb(fp, buf, 7))
        goto ret_error;

    /* write fuses/daemons/alarms */
    if (fiowfda(fp, vctx->voccxdmn, vctx->voccxdmc)
        || fiowfda(fp, vctx->voccxfus, vctx->voccxfuc)
        || fiowfda(fp, vctx->voccxalm, vctx->voccxalc))
        goto ret_error;

    /* write run-time vocabulary additions and deletions */
    fnctx.fp = fp;
    fnctx.err = 0;
    voc_iterate(vctx, MCMONINV, fiosav_voc_cb, &fnctx);
    if (fnctx.err)
        goto ret_error;

    /* write end marker for vocabulary additions and deletions */
    oswp2(buf+6, MCMONINV);
    if (osfwb(fp, buf, 8))
        goto ret_error;

    /* write the current "Me" object */
    oswp2(buf, vctx->voccxme);
    if (osfwb(fp, buf, 2))
        goto ret_error;

    /* done - close file and return success indication */
    osfcls(fp);
    os_settype(fname, OSFTSAVE);
    return FALSE;

    /* come here on failure - close file and return error indication */
ret_error:
    osfcls(fp);
    return TRUE;
}